

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safecrt.h
# Opt level: O3

errno_t wcsncpy_s(WCHAR *_Dst,size_t _SizeInWords,WCHAR *_Src,size_t _Count)

{
  WCHAR WVar1;
  ulong uVar2;
  size_t __n;
  errno_t eVar3;
  long lVar4;
  WCHAR *__s;
  size_t sVar5;
  
  eVar3 = 0;
  if ((_Count == 0 && _SizeInWords == 0) && _Dst == (WCHAR *)0x0) {
    return 0;
  }
  if (_Dst == (WCHAR *)0x0 || _SizeInWords == 0) {
LAB_003619cb:
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
    eVar3 = 0x16;
  }
  else {
    if (_Count == 0) {
      *_Dst = L'\0';
      if (_SizeInWords < 2) {
        return 0;
      }
      __s = _Dst + 1;
      __n = _SizeInWords * 2 - 2;
    }
    else {
      if (_Src == (WCHAR *)0x0) {
        *_Dst = L'\0';
        if (1 < _SizeInWords) {
          memset(_Dst + 1,0xfd,_SizeInWords * 2 - 2);
        }
        goto LAB_003619cb;
      }
      if (_Count == 0xffffffffffffffff) {
        sVar5 = 0;
        do {
          WVar1 = _Src[sVar5];
          _Dst[sVar5] = WVar1;
          if (WVar1 == L'\0') {
            lVar4 = _SizeInWords - sVar5;
            goto LAB_00361b08;
          }
          sVar5 = sVar5 + 1;
        } while (_SizeInWords != sVar5);
LAB_00361af1:
        _Dst[_SizeInWords - 1] = L'\0';
        return 0x50;
      }
      lVar4 = _SizeInWords - _Count;
      sVar5 = 0;
      do {
        WVar1 = _Src[sVar5];
        _Dst[sVar5] = WVar1;
        if (WVar1 == L'\0') {
          lVar4 = _SizeInWords - sVar5;
          goto LAB_00361b08;
        }
        if (_SizeInWords - 1 == sVar5) {
          if (_Count - _SizeInWords != -2) {
            *_Dst = L'\0';
            if (1 < _SizeInWords) {
              memset(_Dst + 1,0xfd,_SizeInWords * 2 - 2);
            }
            RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
            return 0x22;
          }
          goto LAB_00361af1;
        }
        sVar5 = sVar5 + 1;
      } while (_Count != sVar5);
      _Dst[sVar5] = L'\0';
LAB_00361b08:
      uVar2 = (_SizeInWords - lVar4) + 1;
      if (_SizeInWords < uVar2 || _SizeInWords - uVar2 == 0) {
        return 0;
      }
      __s = _Dst + uVar2;
      __n = (_SizeInWords - uVar2) * 2;
    }
    memset(__s,0xfd,__n);
  }
  return eVar3;
}

Assistant:

_SAFECRT__INLINE
errno_t __cdecl wcsncpy_s(WCHAR *_Dst, size_t _SizeInWords, const WCHAR *_Src, size_t _Count)
{
    WCHAR *p;
    size_t available;

    if (_Count == 0 && _Dst == nullptr && _SizeInWords == 0)
    {
        /* this case is allowed; nothing to do */
        return 0;
    }

    /* validation section */
    _SAFECRT__VALIDATE_STRING(_Dst, _SizeInWords);
    if (_Count == 0)
    {
        /* notice that the source string pointer can be nullptr in this case */
        _SAFECRT__RESET_STRING(_Dst, _SizeInWords);
        return 0;
    }
    _SAFECRT__VALIDATE_POINTER_RESET_STRING(_Src, _Dst, _SizeInWords);

    p = _Dst;
    available = _SizeInWords;
    if (_Count == _TRUNCATE)
    {
        while ((*p++ = *_Src++) != 0 && --available > 0)
        {
        }
    }
    else
    {
        while ((*p++ = *_Src++) != 0 && --available > 0 && --_Count > 0)
        {
        }
        if (_Count == 0)
        {
            *p = 0;
        }
    }

    if (available == 0)
    {
        if (_Count == _TRUNCATE)
        {
            _Dst[_SizeInWords - 1] = 0;
            return STRUNCATE;
        }
        _SAFECRT__RESET_STRING(_Dst, _SizeInWords);
        _SAFECRT__RETURN_BUFFER_TOO_SMALL(_Dst, _SizeInWords);
    }
    _SAFECRT__FILL_STRING(_Dst, _SizeInWords, _SizeInWords - available + 1);
    return 0;
}